

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hpp
# Opt level: O2

void __thiscall Experiments::Experiments(Experiments *this,int min,int max)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  __type _Var6;
  
  this->loops = 1000;
  (this->exps).super__Vector_base<Experiments::Node,_std::allocator<Experiments::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->exps).super__Vector_base<Experiments::Node,_std::allocator<Experiments::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->exps).super__Vector_base<Experiments::Node,_std::allocator<Experiments::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var6 = std::log2<int>(max / min);
  iVar1 = (int)(_Var6 + 3.0);
  this->size = iVar1;
  uVar3 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar3 = (long)iVar1 * 4;
  }
  piVar2 = (int *)operator_new__(uVar3);
  this->buf_sizes = piVar2;
  iVar1 = (max * 3) / 2;
  uVar3 = 0;
  uVar5 = (long)min / 2 & 0xffffffff;
  while (iVar4 = (int)uVar5, iVar4 <= iVar1) {
    piVar2[uVar3] = iVar4;
    uVar3 = uVar3 + 1;
    uVar5 = (ulong)(uint)(iVar4 * 2);
  }
  piVar2[uVar3 & 0xffffffff] = iVar1;
  this->buffer = (uint *)0x0;
  return;
}

Assistant:

Experiments::Experiments(int min, int max) {
    size = log2(max / min) + 3;
    buf_sizes = new int[size];
    int n = 0;
    min /= 2;
    while (min <= max * 3 / 2)
    {
        buf_sizes[n++] = min;
        min *= 2;
    }
    buf_sizes[n++] = max * 3 / 2;
    buffer = nullptr;
}